

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool __thiscall
cmListCommand::HandleAppendCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  undefined8 name;
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *r;
  char *value;
  Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_88;
  string local_78;
  undefined1 local_48 [8];
  string listString;
  string *listName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmListCommand *this_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    __assert_fail("args.size() >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmListCommand.cxx"
                  ,0xe9,"bool cmListCommand::HandleAppendCommand(const std::vector<std::string> &)")
    ;
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (2 < sVar2) {
    listString.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](args,1);
    std::__cxx11::string::string((string *)local_48);
    GetListString(this,(string *)local_48,(string *)listString.field_2._8_8_);
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) &&
       (bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(args), !bVar1)) {
      std::__cxx11::string::operator+=((string *)local_48,";");
    }
    local_88 = cmRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(args)
    ;
    r = ContainerAlgorithms::
        Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::advance(&local_88,2);
    cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_78,r,";");
    std::__cxx11::string::operator+=((string *)local_48,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    name = listString.field_2._8_8_;
    this_00 = (this->super_cmCommand).Makefile;
    value = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,(string *)name,value);
    std::__cxx11::string::~string((string *)local_48);
  }
  return true;
}

Assistant:

bool cmListCommand::HandleAppendCommand(std::vector<std::string> const& args)
{
  assert(args.size() >= 2);

  // Skip if nothing to append.
  if(args.size() < 3)
    {
    return true;
    }

  const std::string& listName = args[1];
  // expand the variable
  std::string listString;
  this->GetListString(listString, listName);

  if(!listString.empty() && !args.empty())
    {
    listString += ";";
    }
  listString += cmJoin(cmRange(args).advance(2), ";");

  this->Makefile->AddDefinition(listName, listString.c_str());
  return true;
}